

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,ProjectionLight *p,Transform *args,
          MediumHandle *args_1,Image *args_2,RGBColorSpace **args_3,float *args_4,float *args_5,
          float *args_6,polymorphic_allocator<std::byte> *args_7)

{
  Transform renderFromLight;
  MediumInterface local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  Image local_c8;
  
  local_148 = *(undefined8 *)(args->m).m[0];
  uStack_140 = *(undefined8 *)((args->m).m[0] + 2);
  uStack_138 = *(undefined8 *)(args->m).m[1];
  uStack_130 = *(undefined8 *)((args->m).m[1] + 2);
  uStack_128 = *(undefined8 *)(args->m).m[2];
  uStack_120 = *(undefined8 *)((args->m).m[2] + 2);
  uStack_118 = *(undefined8 *)(args->m).m[3];
  uStack_110 = *(undefined8 *)((args->m).m[3] + 2);
  local_108 = *(undefined8 *)(args->mInv).m[0];
  uStack_100 = *(undefined8 *)((args->mInv).m[0] + 2);
  uStack_f8 = *(undefined8 *)(args->mInv).m[1];
  uStack_f0 = *(undefined8 *)((args->mInv).m[1] + 2);
  uStack_e8 = *(undefined8 *)(args->mInv).m[2];
  uStack_e0 = *(undefined8 *)((args->mInv).m[2] + 2);
  uStack_d8 = *(undefined8 *)(args->mInv).m[3];
  uStack_d0 = *(undefined8 *)((args->mInv).m[3] + 2);
  local_158.inside =
       (MediumHandle)
       (args_1->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_158.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_158.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pbrt::Image::Image(&local_c8,args_2);
  renderFromLight.m.m[0][2] = (Float)(undefined4)uStack_140;
  renderFromLight.m.m[0][3] = (Float)uStack_140._4_4_;
  renderFromLight.m.m[0][0] = (Float)(undefined4)local_148;
  renderFromLight.m.m[0][1] = (Float)local_148._4_4_;
  renderFromLight.m.m[1][0] = (Float)(undefined4)uStack_138;
  renderFromLight.m.m[1][1] = (Float)uStack_138._4_4_;
  renderFromLight.m.m[1][2] = (Float)(undefined4)uStack_130;
  renderFromLight.m.m[1][3] = (Float)uStack_130._4_4_;
  renderFromLight.m.m[2][0] = (Float)(undefined4)uStack_128;
  renderFromLight.m.m[2][1] = (Float)uStack_128._4_4_;
  renderFromLight.m.m[2][2] = (Float)(undefined4)uStack_120;
  renderFromLight.m.m[2][3] = (Float)uStack_120._4_4_;
  renderFromLight.m.m[3][0] = (Float)(undefined4)uStack_118;
  renderFromLight.m.m[3][1] = (Float)uStack_118._4_4_;
  renderFromLight.m.m[3][2] = (Float)(undefined4)uStack_110;
  renderFromLight.m.m[3][3] = (Float)uStack_110._4_4_;
  renderFromLight.mInv.m[0][0] = (Float)(undefined4)local_108;
  renderFromLight.mInv.m[0][1] = (Float)local_108._4_4_;
  renderFromLight.mInv.m[0][2] = (Float)(undefined4)uStack_100;
  renderFromLight.mInv.m[0][3] = (Float)uStack_100._4_4_;
  renderFromLight.mInv.m[1][0] = (Float)(undefined4)uStack_f8;
  renderFromLight.mInv.m[1][1] = (Float)uStack_f8._4_4_;
  renderFromLight.mInv.m[1][2] = (Float)(undefined4)uStack_f0;
  renderFromLight.mInv.m[1][3] = (Float)uStack_f0._4_4_;
  renderFromLight.mInv.m[2][0] = (Float)(undefined4)uStack_e8;
  renderFromLight.mInv.m[2][1] = (Float)uStack_e8._4_4_;
  renderFromLight.mInv.m[2][2] = (Float)(undefined4)uStack_e0;
  renderFromLight.mInv.m[2][3] = (Float)uStack_e0._4_4_;
  renderFromLight.mInv.m[3][0] = (Float)(undefined4)uStack_d8;
  renderFromLight.mInv.m[3][1] = (Float)uStack_d8._4_4_;
  renderFromLight.mInv.m[3][2] = (Float)(undefined4)uStack_d0;
  renderFromLight.mInv.m[3][3] = (Float)uStack_d0._4_4_;
  pbrt::ProjectionLight::ProjectionLight
            (p,renderFromLight,&local_158,&local_c8,*args_3,*args_4,*args_5,*args_6,
             args_7->memoryResource);
  pbrt::Image::~Image(&local_c8);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }